

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.c
# Opt level: O1

void Macro_smpsNoteFill(uint arg_count,long *arg_array)

{
  char *message;
  
  if (arg_count == 0) {
    __assert_fail("arg_count >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Clownacy[P]smps2asm2bin/instruction.c"
                  ,0x251,"void Macro_smpsNoteFill(unsigned int, long *)");
  }
  if (source_driver < 3 && 4 < target_driver) {
    MemoryStream_WriteByte(output_stream,0xff);
    MemoryStream_WriteByte(output_stream,'\n');
    MemoryStream_WriteByte(output_stream,(uchar)*arg_array);
  }
  else {
    if (target_driver < 3 || 2 < source_driver) {
      if (source_driver < 3 || 2 < target_driver) goto LAB_001043da;
      message = 
      "Note fill will not work as intended unless you multiply the fill value by the tempo divider or complain to Flamewing to add an appropriate coordination flag for it.\n"
      ;
    }
    else {
      message = 
      "Note fill will not work as intended unless you divide the fill value by the tempo divider or complain to Flamewing to add an appropriate coordination flag for it.\n"
      ;
    }
    PrintError(message);
  }
LAB_001043da:
  MemoryStream_WriteByte(output_stream,0xe8);
  MemoryStream_WriteByte(output_stream,(uchar)*arg_array);
  return;
}

Assistant:

static void Macro_smpsNoteFill(unsigned int arg_count, long arg_array[])
{
	assert(arg_count >= 1);

	if (target_driver >= 5 && source_driver < 3)
	{
		WriteByte(0xFF);
		WriteByte(0x0A);
		WriteByte(arg_array[0]);
	}
	else
	{
		if (target_driver >= 3 && source_driver < 3)
			PrintError("Note fill will not work as intended unless you divide the fill value by the tempo divider or complain to Flamewing to add an appropriate coordination flag for it.\n");
		else if (target_driver < 3 && source_driver >= 3)
			PrintError("Note fill will not work as intended unless you multiply the fill value by the tempo divider or complain to Flamewing to add an appropriate coordination flag for it.\n");
	}

	WriteByte(0xE8);
	WriteByte(arg_array[0]);
}